

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char *pcVar2;
  undefined8 uVar3;
  int iVar4;
  XML_Convert_Result XVar5;
  undefined8 in_RAX;
  char **ppcVar6;
  long lVar7;
  char **ppcVar8;
  uint uVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  unsigned_short *in_R8;
  long lVar11;
  int tok;
  undefined8 uStack_38;
  uint uVar10;
  
  ppcVar6 = (char **)(end + -(long)ptr);
  if ((long)ppcVar6 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uStack_38 = in_RAX;
  if (bVar1 < 0x16) {
    if (bVar1 == 5) {
      if (ppcVar6 == (char **)0x1) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[1])(enc,ptr,end,ppcVar6);
      lVar11 = 2;
    }
    else if (bVar1 == 6) {
      if ((long)ppcVar6 < 3) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[2])(enc,ptr,end,ppcVar6);
      lVar11 = 3;
    }
    else {
      if (bVar1 != 7) goto LAB_004dfd81;
      if ((long)ppcVar6 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])(enc,ptr,end,ppcVar6);
      lVar11 = 4;
    }
    if (iVar4 == 0) {
LAB_004dfd81:
      *nextTokPtr = ptr;
      return 0;
    }
  }
  else {
    lVar11 = 1;
    if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto LAB_004dfd81;
  }
  ppcVar6 = (char **)(ptr + lVar11);
  uVar3 = uStack_38;
  do {
    lVar11 = (long)end - (long)ppcVar6;
    if (lVar11 < 1) {
      return -1;
    }
    uStack_38._4_4_ = (int)((ulong)uVar3 >> 0x20);
    uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar6);
    uVar9 = uVar10 - 5;
    if (0x18 < uVar9) {
switchD_004dfd06_caseD_8:
      ppcVar8 = ppcVar6;
LAB_004dfecf:
      *nextTokPtr = (char *)ppcVar8;
      return 0;
    }
    lVar7 = 1;
    uStack_38 = uVar3;
    switch(uVar10) {
    case 5:
      if (lVar11 == 1) {
        return -2;
      }
      XVar5 = (*enc[2].utf16Convert)
                        (enc,ppcVar6,
                         (char *)((long)&switchD_004dfd06::switchdataD_005ec2b4 +
                                 (long)(int)(&switchD_004dfd06::switchdataD_005ec2b4)[uVar9]),
                         (unsigned_short **)0x1,in_R8);
      lVar7 = 2;
      break;
    case 6:
      if (lVar11 < 3) {
        return -2;
      }
      XVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar6);
      lVar7 = 3;
      break;
    case 7:
      if (lVar11 < 4) {
        return -2;
      }
      XVar5 = (*enc[3].scanners[0])
                        (enc,(char *)ppcVar6,
                         (char *)((long)&switchD_004dfd06::switchdataD_005ec2b4 +
                                 (long)(int)(&switchD_004dfd06::switchdataD_005ec2b4)[uVar9]),
                         (char **)0x1);
      lVar7 = 4;
      break;
    default:
      goto switchD_004dfd06_caseD_8;
    case 9:
    case 10:
    case 0x15:
      iVar4 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ppcVar6,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar4 == 0) goto switchD_004dfd06_caseD_1d;
      ppcVar8 = (char **)((long)ppcVar6 + 1);
      pcVar2 = extraout_RDX;
      uVar3 = uStack_38;
      goto joined_r0x004dfdb9;
    case 0xf:
      iVar4 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ppcVar6,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar4 == 0) goto switchD_004dfd06_caseD_1d;
      ppcVar8 = (char **)((long)ppcVar6 + 1);
      if ((char **)end == ppcVar8 || (long)end - (long)ppcVar8 < 0) {
        return -1;
      }
      if (*(char *)ppcVar8 != '>') goto LAB_004dfecf;
      goto LAB_004dfeb4;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004dfd06_caseD_16;
    case 0x1d:
      goto switchD_004dfd06_caseD_1d;
    }
    uVar3 = uStack_38;
    if (XVar5 == XML_CONVERT_COMPLETED) goto switchD_004dfd06_caseD_1d;
switchD_004dfd06_caseD_16:
    uStack_38 = uVar3;
    ppcVar6 = (char **)((long)ppcVar6 + lVar7);
    uVar3 = uStack_38;
  } while( true );
joined_r0x004dfdb9:
  ppcVar6 = ppcVar8;
  lVar11 = (long)end - (long)ppcVar6;
  if (lVar11 < 1) {
    return -1;
  }
  uStack_38._4_4_ = (int)((ulong)uVar3 >> 0x20);
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar6);
  if (0xf < (ulong)bVar1) {
switchD_004dfdde_caseD_2:
    ppcVar8 = (char **)((long)ppcVar6 + 1);
    goto joined_r0x004dfdb9;
  }
  uStack_38 = uVar3;
  switch(bVar1) {
  case 0:
  case 1:
  case 8:
switchD_004dfd06_caseD_1d:
    *nextTokPtr = (char *)ppcVar6;
    return 0;
  default:
    goto switchD_004dfdde_caseD_2;
  case 5:
    if (lVar11 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])
                      (enc,(char *)ppcVar6,pcVar2,
                       (char **)((long)&switchD_004dfdde::switchdataD_005ec318 +
                                (long)(int)(&switchD_004dfdde::switchdataD_005ec318)[bVar1]));
    if (iVar4 != 0) goto switchD_004dfd06_caseD_1d;
    ppcVar8 = (char **)((long)ppcVar6 + 2);
    pcVar2 = extraout_RDX_00;
    uVar3 = uStack_38;
    break;
  case 6:
    if (lVar11 < 3) {
      return -2;
    }
    iVar4 = (*enc[3].sameName)(enc,(char *)ppcVar6,pcVar2);
    if (iVar4 != 0) goto switchD_004dfd06_caseD_1d;
    ppcVar8 = (char **)((long)ppcVar6 + 3);
    pcVar2 = extraout_RDX_01;
    uVar3 = uStack_38;
    break;
  case 7:
    if (lVar11 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)
                      (enc,(char *)ppcVar6,pcVar2,
                       (char *)((long)&switchD_004dfdde::switchdataD_005ec318 +
                               (long)(int)(&switchD_004dfdde::switchdataD_005ec318)[bVar1]));
    if (iVar4 != 0) goto switchD_004dfd06_caseD_1d;
    ppcVar8 = (char **)((long)ppcVar6 + 4);
    pcVar2 = extraout_RDX_02;
    uVar3 = uStack_38;
    break;
  case 0xf:
    ppcVar8 = (char **)((long)ppcVar6 + 1);
    if ((char **)end == ppcVar8 || (long)end - (long)ppcVar8 < 0) {
      return -1;
    }
    if (*(byte *)ppcVar8 == 0x3e) {
LAB_004dfeb4:
      *nextTokPtr = (char *)((long)ppcVar6 + 2);
      return uStack_38._4_4_;
    }
  }
  goto joined_r0x004dfdb9;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr,
               const char *end, const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}